

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void create_colorindex(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_color_quantizer *pjVar2;
  undefined1 *puVar3;
  JSAMPARRAY ppJVar4;
  j_decompress_ptr in_RDI;
  int pad;
  int val;
  int blksize;
  int nci;
  int k;
  int j;
  int i;
  JSAMPROW indexptr;
  my_cquantize_ptr cquantize;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  
  pjVar2 = in_RDI->cquantize;
  if (in_RDI->dither_mode == JDITHER_ORDERED) {
    local_34 = 0x1fe;
    *(undefined4 *)&pjVar2[1].new_color_map = 1;
  }
  else {
    local_34 = 0;
    *(undefined4 *)&pjVar2[1].new_color_map = 0;
  }
  ppJVar4 = (*in_RDI->mem->alloc_sarray)
                      ((j_common_ptr)in_RDI,1,local_34 + 0x100,in_RDI->out_color_components);
  pjVar2[1].finish_pass = (_func_void_j_decompress_ptr *)ppJVar4;
  local_2c = *(int *)&pjVar2[1].color_quantize;
  for (local_1c = 0; local_1c < in_RDI->out_color_components; local_1c = local_1c + 1) {
    iVar1 = *(int *)((long)&pjVar2[1].new_color_map + (long)local_1c * 4 + 4);
    local_2c = local_2c / iVar1;
    if (local_34 != 0) {
      *(long *)(pjVar2[1].finish_pass + (long)local_1c * 8) =
           *(long *)(pjVar2[1].finish_pass + (long)local_1c * 8) + 0xff;
    }
    puVar3 = *(undefined1 **)(pjVar2[1].finish_pass + (long)local_1c * 8);
    local_30 = 0;
    local_24 = largest_input_value(in_RDI,local_1c,0,iVar1 + -1);
    for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
      while (local_24 < local_20) {
        local_30 = local_30 + 1;
        local_24 = largest_input_value(in_RDI,local_1c,local_30,iVar1 + -1);
      }
      puVar3[local_20] = (char)local_30 * (char)local_2c;
    }
    if (local_34 != 0) {
      for (local_20 = 1; local_20 < 0x100; local_20 = local_20 + 1) {
        puVar3[-local_20] = *puVar3;
        puVar3[local_20 + 0xff] = puVar3[0xff];
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
create_colorindex(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPROW indexptr;
  int i, j, k, nci, blksize, val, pad;

  /* For ordered dither, we pad the color index tables by MAXJSAMPLE in
   * each direction (input index values can be -MAXJSAMPLE .. 2*MAXJSAMPLE).
   * This is not necessary in the other dithering modes.  However, we
   * flag whether it was done in case user changes dithering mode.
   */
  if (cinfo->dither_mode == JDITHER_ORDERED) {
    pad = MAXJSAMPLE * 2;
    cquantize->is_padded = TRUE;
  } else {
    pad = 0;
    cquantize->is_padded = FALSE;
  }

  cquantize->colorindex = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)(MAXJSAMPLE + 1 + pad),
     (JDIMENSION)cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  blksize = cquantize->sv_actual;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colorindex entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blksize / nci;

    /* adjust colorindex pointers to provide padding at negative indexes. */
    if (pad)
      cquantize->colorindex[i] += MAXJSAMPLE;

    /* in loop, val = index of current output value, */
    /* and k = largest j that maps to current val */
    indexptr = cquantize->colorindex[i];
    val = 0;
    k = largest_input_value(cinfo, i, 0, nci - 1);
    for (j = 0; j <= MAXJSAMPLE; j++) {
      while (j > k)             /* advance val if past boundary */
        k = largest_input_value(cinfo, i, ++val, nci - 1);
      /* premultiply so that no multiplication needed in main processing */
      indexptr[j] = (JSAMPLE)(val * blksize);
    }
    /* Pad at both ends if necessary */
    if (pad)
      for (j = 1; j <= MAXJSAMPLE; j++) {
        indexptr[-j] = indexptr[0];
        indexptr[MAXJSAMPLE + j] = indexptr[MAXJSAMPLE];
      }
  }
}